

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPropertyComputer.cxx
# Opt level: O1

bool cmTargetPropertyComputer::WhiteListedInterfaceProperty(string *prop)

{
  char *pcVar1;
  int iVar2;
  const_iterator cVar3;
  long *plVar4;
  long lVar5;
  bool bVar6;
  undefined1 local_1d3;
  undefined1 local_1d2;
  undefined1 local_1d1;
  undefined1 *local_1d0 [2];
  undefined1 local_1c0 [16];
  undefined1 *local_1b0 [2];
  undefined1 local_1a0 [16];
  undefined1 *local_190 [2];
  undefined1 local_180 [16];
  undefined1 *local_170 [2];
  undefined1 local_160 [16];
  undefined1 *local_150 [2];
  undefined1 local_140 [16];
  undefined1 *local_130 [2];
  undefined1 local_120 [16];
  undefined1 *local_110 [2];
  undefined1 local_100 [16];
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  long *local_50 [2];
  long local_40 [2];
  
  pcVar1 = (prop->_M_dataplus)._M_p;
  iVar2 = strncmp(pcVar1,"INTERFACE_",10);
  bVar6 = true;
  if ((iVar2 != 0) && (iVar2 = (int)*pcVar1, iVar2 != 0x5f)) {
    iVar2 = islower(iVar2);
    if (iVar2 == 0) {
      if (WhiteListedInterfaceProperty(std::__cxx11::string_const&)::builtIns_abi_cxx11_ == '\0') {
        iVar2 = __cxa_guard_acquire(&WhiteListedInterfaceProperty(std::__cxx11::string_const&)::
                                     builtIns_abi_cxx11_);
        if (iVar2 != 0) {
          local_1d0[0] = local_1c0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1d0,"COMPATIBLE_INTERFACE_BOOL","");
          local_1b0[0] = local_1a0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1b0,"COMPATIBLE_INTERFACE_NUMBER_MAX","");
          local_190[0] = local_180;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_190,"COMPATIBLE_INTERFACE_NUMBER_MIN","");
          local_170[0] = local_160;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_170,"COMPATIBLE_INTERFACE_STRING","");
          local_150[0] = local_140;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"EXPORT_NAME","");
          local_130[0] = local_120;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_130,"EXPORT_PROPERTIES","");
          local_110[0] = local_100;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"IMPORTED","");
          local_f0[0] = local_e0;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"IMPORTED_GLOBAL","");
          local_d0[0] = local_c0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_d0,"MANUALLY_ADDED_DEPENDENCIES","");
          local_b0[0] = local_a0;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"NAME","");
          local_90[0] = local_80;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"PRIVATE_HEADER","");
          local_70[0] = local_60;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"PUBLIC_HEADER","");
          plVar4 = local_40;
          local_50[0] = plVar4;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"TYPE","");
          std::
          _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::_Hashtable<std::__cxx11::string_const*>
                    ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)&WhiteListedInterfaceProperty(std::__cxx11::string_const&)::
                         builtIns_abi_cxx11_,local_1d0,&stack0xffffffffffffffd0,0,&local_1d1,
                     &local_1d2,&local_1d3);
          lVar5 = -0x1a0;
          do {
            if (plVar4 != (long *)plVar4[-2]) {
              operator_delete((long *)plVar4[-2],*plVar4 + 1);
            }
            plVar4 = plVar4 + -4;
            lVar5 = lVar5 + 0x20;
          } while (lVar5 != 0);
          __cxa_atexit(std::
                       unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::~unordered_set,
                       &WhiteListedInterfaceProperty(std::__cxx11::string_const&)::
                        builtIns_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&WhiteListedInterfaceProperty(std::__cxx11::string_const&)::
                               builtIns_abi_cxx11_);
        }
      }
      cVar3 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find(&WhiteListedInterfaceProperty(std::__cxx11::string_const&)::builtIns_abi_cxx11_
                      ._M_h,prop);
      if (cVar3.
          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        iVar2 = std::__cxx11::string::compare((char *)prop);
        if (iVar2 != 0) {
          iVar2 = std::__cxx11::string::compare((char *)prop);
          if (iVar2 != 0) {
            pcVar1 = (prop->_M_dataplus)._M_p;
            iVar2 = strncmp(pcVar1,"IMPORTED_LIBNAME_",0x11);
            if (iVar2 != 0) {
              iVar2 = strncmp(pcVar1,"MAP_IMPORTED_CONFIG_",0x14);
              if (iVar2 != 0) {
                iVar2 = std::__cxx11::string::compare((char *)prop);
                bVar6 = iVar2 == 0;
              }
            }
          }
        }
      }
    }
  }
  return bVar6;
}

Assistant:

bool cmTargetPropertyComputer::WhiteListedInterfaceProperty(
  const std::string& prop)
{
  if (cmHasLiteralPrefix(prop, "INTERFACE_")) {
    return true;
  }
  if (cmHasLiteralPrefix(prop, "_")) {
    return true;
  }
  if (std::islower(prop[0])) {
    return true;
  }
  static std::unordered_set<std::string> const builtIns{
    "COMPATIBLE_INTERFACE_BOOL",
    "COMPATIBLE_INTERFACE_NUMBER_MAX",
    "COMPATIBLE_INTERFACE_NUMBER_MIN",
    "COMPATIBLE_INTERFACE_STRING",
    "EXPORT_NAME",
    "EXPORT_PROPERTIES",
    "IMPORTED",
    "IMPORTED_GLOBAL",
    "MANUALLY_ADDED_DEPENDENCIES",
    "NAME",
    "PRIVATE_HEADER",
    "PUBLIC_HEADER",
    "TYPE"
  };

  if (builtIns.count(prop)) {
    return true;
  }

  if (prop == "IMPORTED_CONFIGURATIONS" || prop == "IMPORTED_LIBNAME" ||
      cmHasLiteralPrefix(prop, "IMPORTED_LIBNAME_") ||
      cmHasLiteralPrefix(prop, "MAP_IMPORTED_CONFIG_")) {
    return true;
  }

  // This property should not be allowed but was incorrectly added in
  // CMake 3.8.  We can't remove it from the whitelist without breaking
  // projects that try to set it.  One day we could warn about this, but
  // for now silently accept it.
  if (prop == "NO_SYSTEM_FROM_IMPORTED") {
    return true;
  }

  return false;
}